

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test264.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  uint32_t (*pauVar2) [4];
  int iVar3;
  FILE *pFVar4;
  bitstream *pbVar5;
  h264_seqparm *phVar6;
  h264_picparm *phVar7;
  h264_slice *slice;
  h264_macroblock *phVar8;
  int32_t (*paaiVar9) [16] [16];
  int32_t (*paaiVar10) [8] [15];
  uint uVar11;
  int32_t *piVar12;
  int iVar13;
  uint32_t uVar14;
  uint uVar15;
  ulong uVar16;
  uint32_t *puVar17;
  uint32_t *puVar18;
  uint32_t *puVar19;
  uint32_t uVar20;
  long lVar21;
  long lVar22;
  uint32_t *puVar23;
  int32_t (*paaiVar24) [16] [15];
  uint uVar25;
  ulong uVar26;
  uint32_t val;
  int32_t *local_a8;
  uint32_t local_9c;
  uint32_t *local_98;
  int32_t (*local_90) [8] [15];
  h264_macroblock *local_88;
  uint32_t local_7c;
  int32_t (*local_78) [16] [16];
  int32_t (*local_70) [16] [15];
  int32_t (*local_68) [8];
  uint32_t (*local_60) [4];
  int32_t (*local_58) [4] [64];
  FILE *local_50;
  bitstream *local_48;
  uint32_t (*local_40) [4];
  h264_slice *local_38;
  
  if (argc < 2) {
    pFVar4 = (FILE *)0x0;
  }
  else {
    pFVar4 = fopen(argv[1],"w");
    if (pFVar4 == (FILE *)0x0) {
      perror("fopen");
      return 1;
    }
  }
  pbVar5 = vs_new_encode(VS_H264);
  local_9c = 0xde;
  iVar3 = vs_start(pbVar5,&local_9c);
  iVar13 = 1;
  if (iVar3 == 0) {
    local_50 = pFVar4;
    local_48 = pbVar5;
    phVar6 = (h264_seqparm *)calloc(0xcd8,1);
    phVar7 = (h264_picparm *)calloc(0x8a8,1);
    slice = (h264_slice *)calloc(0xc48,1);
    phVar6->frame_mbs_only_flag = 0;
    phVar6->direct_8x8_inference_flag = 0;
    phVar7->num_slice_groups_minus1 = 0;
    phVar7->constrained_intra_pred_flag = 0;
    phVar7->transform_8x8_mode_flag = 1;
    phVar7->entropy_coding_mode_flag = 1;
    slice->seqparm = phVar6;
    slice->picparm = phVar7;
    slice->pic_width_in_mbs = 8;
    slice->pic_size_in_mbs = 0xc0;
    slice->sliceqpy = 0x1a;
    slice->first_mb_in_slice = 0;
    slice->nal_unit_type = 1;
    slice->slice_type = 0;
    slice->mbaff_frame_flag = 0;
    slice->field_pic_flag = 1;
    slice->cabac_init_idc = 2;
    slice->chroma_array_type = 1;
    slice->num_ref_idx_l0_active_minus1 = 0x1f;
    slice->num_ref_idx_l1_active_minus1 = 0x1f;
    slice->bit_depth_luma_minus8 = 0;
    slice->bit_depth_chroma_minus8 = 0;
    phVar8 = (h264_macroblock *)calloc(0x3774,0xc0);
    pbVar5 = local_48;
    slice->mbs = phVar8;
    local_7c = slice->mbaff_frame_flag;
    local_a8 = phVar8->mvd[0][0] + 1;
    puVar17 = phVar8->rem_intra4x4_pred_mode;
    puVar18 = phVar8->rem_intra8x8_pred_mode;
    puVar19 = phVar8->pcm_sample_chroma;
    local_70 = phVar8->block_luma_ac;
    local_78 = phVar8->block_luma_4x4;
    local_58 = phVar8->block_luma_8x8;
    local_68 = phVar8->block_chroma_dc;
    uVar26 = 0;
    pauVar2 = phVar8->ref_idx;
    paaiVar10 = phVar8->block_chroma_ac;
    do {
      local_90 = paaiVar10;
      local_60 = pauVar2;
      uVar25 = (uint)uVar26;
      uVar1 = (uint)(uVar26 >> 2);
      local_88 = phVar8 + uVar26;
      phVar8[uVar26].mb_field_decoding_flag = uVar1 & 1;
      phVar8[uVar26].coded_block_pattern = (uVar25 * 3) % 0x30;
      local_98 = &phVar8[uVar26].transform_size_8x8_flag;
      phVar8[uVar26].transform_size_8x8_flag = uVar25 & 1;
      phVar8[uVar26].mb_qp_delta = (int)((uVar26 & 0xffffffff) / 5) * -5 + uVar25 + -2;
      if (uVar26 < 0x10) {
        phVar8[uVar26].mb_type = 0;
      }
      else if (uVar26 < 0x28) {
        phVar8[uVar26].mb_type = uVar25 - 0xf;
      }
      else if (uVar26 < 0x2c) {
LAB_00101987:
        phVar8[uVar26].mb_type = 0x19;
      }
      else if (slice->slice_type == 1) {
        phVar8[uVar26].mb_type = 0x38;
      }
      else {
        if (slice->slice_type != 0) goto LAB_00101987;
        if (uVar26 < 0x30) {
          phVar8[uVar26].mb_type = 0x20;
        }
        else if (uVar26 < 0x48) {
          uVar15 = (uint)(uVar26 - 0x30 >> 3) & 0x1fffffff;
          phVar8[uVar26].mb_type = uVar15 + 0x1b;
          if (uVar26 - 0x30 < 8) {
            lVar21 = 0;
            do {
              (*local_60)[lVar21] = (uVar25 & 7) + 0xf;
              lVar21 = lVar21 + 1;
            } while (lVar21 != 4);
            lVar21 = 0;
            do {
              local_a8[lVar21 * 2 + -1] = -3 - (uVar25 & 7);
              local_a8[lVar21 * 2] = uVar25 & 3;
              lVar21 = lVar21 + 1;
            } while (lVar21 != 0x10);
          }
          else if (uVar15 == 1) {
            uVar16 = 0;
            do {
              (*local_60)[uVar16] = (uint)(uVar16 >> 1) & 0x7fffffff | 4;
              uVar16 = uVar16 + 1;
            } while (uVar16 != 4);
            uVar16 = 0;
            do {
              uVar15 = (uint)(uVar16 >> 3) & 0x1fffffff;
              local_a8[uVar16 * 2 + -1] = uVar15 | 0xc;
              local_a8[uVar16 * 2] = -uVar15;
              uVar16 = uVar16 + 1;
            } while (uVar16 != 0x10);
          }
          else {
            lVar21 = 0;
            do {
              (*local_60)[lVar21] = (uint)lVar21 | 2;
              lVar21 = lVar21 + 1;
            } while (lVar21 != 4);
            uVar16 = 0;
            do {
              local_a8[uVar16 * 2 + -1] = (uint)(uVar16 >> 2) & 0x3fffffff | 6;
              local_a8[uVar16 * 2] = -(uint)(((uint)uVar16 >> 2 & 1) != 0);
              uVar16 = uVar16 + 1;
            } while (uVar16 != 0x10);
          }
        }
        else {
          phVar8[uVar26].mb_type = 0x1e;
          *local_98 = 0;
          local_40 = phVar8[uVar26].ref_idx;
          piVar12 = local_a8;
          lVar21 = 0;
          do {
            local_88->sub_mb_type[lVar21] = (uint32_t)lVar21;
            lVar22 = lVar21 + 1;
            (*local_40)[lVar21] = (uint32_t)lVar22;
            uVar15 = (&DAT_0010a020)[lVar21];
            iVar3 = (uint32_t)lVar21 * 4;
            lVar21 = 0;
            do {
              uVar11 = uVar15 & (uint)lVar21;
              piVar12[lVar21 * 2 + -1] = uVar11 + iVar3 + 0x10;
              piVar12[lVar21 * 2] = uVar11 + iVar3 + -0x20;
              lVar21 = lVar21 + 1;
            } while (lVar21 != 4);
            piVar12 = piVar12 + 8;
            lVar21 = lVar22;
            local_38 = slice;
          } while (lVar22 != 4);
        }
      }
      if ((phVar8[uVar26].mb_type == 0x1a) || (phVar8[uVar26].mb_type == 0)) {
        uVar16 = 0;
        do {
          puVar17[uVar16 - 0x10] = (uint)uVar16 & 1;
          puVar17[uVar16] = (uint)(uVar16 >> 1) & 0x7fffffff;
          uVar16 = uVar16 + 1;
        } while (uVar16 != 0x10);
        uVar16 = 0;
        do {
          puVar18[uVar16 - 4] = (uint)uVar16 & 1;
          puVar18[uVar16] = (uint)(uVar16 >> 1) & 0x7fffffff;
          uVar16 = uVar16 + 1;
        } while (uVar16 != 4);
      }
      uVar15 = local_88->mb_type;
      if (uVar15 < 0x1b) {
        local_88->intra_chroma_pred_mode = uVar1 & 3;
      }
      if (uVar15 == 0x19) {
        local_88->coded_block_pattern = 0x2f;
        *local_98 = 0;
        phVar8[uVar26].mb_qp_delta = 0;
        phVar8[uVar26].intra_chroma_pred_mode = 0;
        lVar21 = 0;
        do {
          if ((uVar26 & 1) != 0) {
            puVar19[lVar21] = (uint32_t)lVar21;
          }
          if ((uVar26 & 2) != 0) {
            puVar19[lVar21 + -0x100] = (uint32_t)lVar21;
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 != 0x100);
      }
      else {
        puVar23 = &phVar8[uVar26].coded_block_pattern;
        if ((uVar15 == 0x38) || (uVar15 == 0x20)) {
          local_88->mb_field_decoding_flag = 0;
          *puVar23 = 0;
          *local_98 = 0;
          phVar8[uVar26].mb_qp_delta = 0;
          phVar8[uVar26].intra_chroma_pred_mode = 0;
        }
        else {
          if (uVar15 - 0x19 < 0xffffffe8) {
            if (local_88->coded_block_pattern == 0) {
              local_88->mb_qp_delta = 0;
            }
            iVar3 = 0;
            uVar16 = 0;
            paaiVar9 = local_78;
            do {
              if ((*puVar23 >> ((uint)(uVar16 >> 2) & 0x1f) & 1) != 0) {
                lVar21 = 0;
                do {
                  if (uVar16 != 0) {
                    iVar13 = iVar3 + (int)lVar21;
                    (*paaiVar9)[0][lVar21] = iVar13;
                    *(int *)((long)(*local_58)[0] +
                            lVar21 * 4 +
                            ((ulong)(((uint)uVar16 & 3) << 6) | (uVar16 & 0xfffffffffffffffc) << 6))
                         = iVar13;
                  }
                  lVar21 = lVar21 + 1;
                } while (lVar21 != 0x10);
              }
              uVar16 = uVar16 + 1;
              iVar3 = iVar3 + 0x10;
              paaiVar9 = (int32_t (*) [16] [16])(*paaiVar9 + 1);
            } while (uVar16 != 0x10);
          }
          else {
            uVar14 = (((int)(phVar8[uVar26].mb_type - 1) >> 2) % 3) * 0x10;
            uVar20 = uVar14 + 0xf;
            if ((int)phVar8[uVar26].mb_type < 0xd) {
              uVar20 = uVar14;
            }
            *puVar23 = uVar20;
            *local_98 = 0;
            iVar3 = 1;
            uVar16 = 0;
            paaiVar24 = local_70;
            do {
              phVar8[uVar26].block_luma_dc[0][uVar16] = (uint)uVar16 | 0x100;
              if ((*puVar23 >> ((uint)(uVar16 >> 2) & 0x1f) & 1) != 0) {
                lVar21 = 0;
                do {
                  if (uVar16 != 0) {
                    (*paaiVar24)[0][lVar21] = iVar3 + (int)lVar21;
                  }
                  lVar21 = lVar21 + 1;
                } while (lVar21 != 0xf);
              }
              uVar16 = uVar16 + 1;
              paaiVar24 = (int32_t (*) [16] [15])(*paaiVar24 + 1);
              iVar3 = iVar3 + 0x10;
            } while (uVar16 != 0x10);
          }
          if ((*puVar23 & 0x30) != 0) {
            lVar21 = 0;
            do {
              *(uint *)((long)*local_68 + lVar21 * 4 + (ulong)((uVar25 & 1) << 5)) =
                   (uint)lVar21 | 0xfffffff0;
              lVar21 = lVar21 + 1;
            } while (lVar21 != 4);
          }
          if ((*puVar23 & 0x20) != 0) {
            paaiVar10 = local_90 + ((uint)(uVar26 >> 1) & 1);
            iVar3 = -0x1000;
            lVar21 = 0;
            do {
              lVar22 = 0;
              do {
                if (lVar21 != 1) {
                  (*paaiVar10)[0][lVar22] = iVar3 + (int)lVar22;
                }
                lVar22 = lVar22 + 1;
              } while (lVar22 != 0xf);
              lVar21 = lVar21 + 1;
              paaiVar10 = (int32_t (*) [8] [15])(*paaiVar10 + 1);
              iVar3 = iVar3 + 0x100;
            } while (lVar21 != 4);
          }
        }
      }
      if (local_7c == 0) {
        local_88->mb_field_decoding_flag = slice->field_pic_flag;
      }
      uVar26 = uVar26 + 1;
      local_a8 = local_a8 + 0xddd;
      puVar17 = puVar17 + 0xddd;
      puVar18 = puVar18 + 0xddd;
      puVar19 = puVar19 + 0xddd;
      local_70 = (int32_t (*) [16] [15])((long)(local_70 + 0xe) + 0x2f4);
      local_78 = (int32_t (*) [16] [16])((long)(local_78 + 0xd) + 0x374);
      local_58 = (int32_t (*) [4] [64])((long)(local_58 + 0xd) + 0x374);
      local_68 = (int32_t (*) [8])((long)(local_68 + 0x1bb) + 0x14);
      pauVar2 = (uint32_t (*) [4])((long)(local_60 + 0x377) + 4);
      paaiVar10 = (int32_t (*) [8] [15])((long)(local_90 + 0x1d) + 0x114);
    } while (uVar26 != 0x60);
    slice->last_mb_in_slice = 0x5f;
    iVar3 = h264_slice_data(local_48,slice);
    iVar13 = 1;
    if (iVar3 == 0) {
      if (local_50 != (FILE *)0x0) {
        fwrite(pbVar5->bytes,(long)pbVar5->bytesnum,1,local_50);
      }
      pbVar5 = vs_new_decode(VS_H264,pbVar5->bytes,pbVar5->bytesnum);
      iVar3 = vs_start(pbVar5,&local_9c);
      if (iVar3 == 0) {
        if (local_9c == 0xde) {
          iVar3 = h264_slice_data(pbVar5,slice);
          h264_print_slice_data(slice);
          if (iVar3 == 0) {
            main_cold_2();
            iVar13 = 0;
          }
        }
        else {
          main_cold_1();
        }
      }
    }
  }
  return iVar13;
}

Assistant:

int main(int argc, char **argv) {
	FILE *out = 0;
	if (argc >= 2) {
		out = fopen(argv[1], "w");
		if (!out) {
			perror("fopen");
			return 1;
		}
	}
	struct bitstream *str = vs_new_encode(VS_H264);
	uint32_t val;
	val = 0xde;
	if (vs_start(str, &val))
		return 1;

	struct h264_seqparm *seqparm = calloc(sizeof *seqparm, 1);
	struct h264_picparm *picparm = calloc(sizeof *picparm, 1);
	struct h264_slice *slice = calloc(sizeof *slice, 1);
	seqparm->frame_mbs_only_flag = 0;
	seqparm->direct_8x8_inference_flag = 0;
	picparm->num_slice_groups_minus1 = 0;
	picparm->constrained_intra_pred_flag = 0;
	picparm->transform_8x8_mode_flag = 1;
	picparm->entropy_coding_mode_flag = 1;
	slice->seqparm = seqparm;
	slice->picparm = picparm;
	slice->sliceqpy = 26;
	slice->pic_width_in_mbs = 8;
	slice->pic_size_in_mbs = slice->pic_width_in_mbs * 24;
	slice->first_mb_in_slice = 0;
	slice->nal_unit_type = 1;
	slice->slice_type = H264_SLICE_TYPE_P;
	slice->mbaff_frame_flag = 0;
	slice->field_pic_flag = 1;
	slice->cabac_init_idc = 2;
	slice->chroma_array_type = 1;
	slice->num_ref_idx_l0_active_minus1 = 31;
	slice->num_ref_idx_l1_active_minus1 = 31;
	slice->bit_depth_luma_minus8 = 0;
	slice->bit_depth_chroma_minus8 = 0;
	slice->mbs = calloc(sizeof *slice->mbs, slice->pic_size_in_mbs);
	int i, j, k;
	for (i = 0; i < 96; i++) {
		slice->mbs[i].mb_field_decoding_flag = i >> 2 & 1;
		slice->mbs[i].coded_block_pattern = i * 3 % 48;
		slice->mbs[i].transform_size_8x8_flag = i& 1;
		slice->mbs[i].mb_qp_delta = (i%5) - 2;
		if (i < 16) {
			slice->mbs[i].mb_type = 0;
		} else if (i < 40) {
			slice->mbs[i].mb_type = 1 + (i- 16);
		} else if (i >= 44 && slice->slice_type == H264_SLICE_TYPE_P) {
			if (i < 48) {
				slice->mbs[i].mb_type = H264_MB_TYPE_P_SKIP;
			} else if (i < 72) {
				int x = (i - 48)/8;
				slice->mbs[i].mb_type = H264_MB_TYPE_P_L0_16X16 + x;
				if (x == 0) {
					for (j = 0; j < 4; j++)
						slice->mbs[i].ref_idx[0][j] = 15 + (i & 7);
					for (j = 0; j < 16; j++) {
						slice->mbs[i].mvd[0][j][0] = -((i & 7) + 3);
						slice->mbs[i].mvd[0][j][1] = (i&3);
					}
				} else if (x == 1) {
					for (j = 0; j < 4; j++)
						slice->mbs[i].ref_idx[0][j] = 4 + (j >> 1);
					for (j = 0; j < 16; j++) {
						slice->mbs[i].mvd[0][j][0] = 12 + (j >> 3);
						slice->mbs[i].mvd[0][j][1] = -(j >> 3);
					}
				} else if (x == 2) {
					for (j = 0; j < 4; j++)
						slice->mbs[i].ref_idx[0][j] = 2 + (j & 1);
					for (j = 0; j < 16; j++) {
						slice->mbs[i].mvd[0][j][0] = 6 + (j>>2 & 1);
						slice->mbs[i].mvd[0][j][1] = -(j>>2 & 1);
					}
				}
			} else {
				slice->mbs[i].mb_type = H264_MB_TYPE_P_8X8;
				slice->mbs[i].transform_size_8x8_flag = 0;
				for (j = 0; j < 4; j++) {
					slice->mbs[i].sub_mb_type[j] = j;
					slice->mbs[i].ref_idx[0][j] = j+1;
					int tt[4] = { 0, 2, 1, 3};
					for (k = 0; k < 4; k++) {
						int kk = j * 4 + (k & j[tt]);
						slice->mbs[i].mvd[0][j*4+k][0] = 16+kk;
						slice->mbs[i].mvd[0][j*4+k][1] = kk - 32;;
					}
				}
			}
		} else if (i >= 44 && slice->slice_type == H264_SLICE_TYPE_B) {
			if (i < 48) {
				slice->mbs[i].mb_type = H264_MB_TYPE_B_SKIP;
			} else if (i < 72) {
				/* XXX */
				slice->mbs[i].mb_type = H264_MB_TYPE_B_SKIP;
			} else {
				/* XXX */
				slice->mbs[i].mb_type = H264_MB_TYPE_B_SKIP;
			}
		} else {
			slice->mbs[i].mb_type = H264_MB_TYPE_I_PCM;
		}
		if (slice->mbs[i].mb_type == H264_MB_TYPE_I_NXN || slice->mbs[i].mb_type == H264_MB_TYPE_SI) {
			for (j = 0; j < 16; j++) {
				slice->mbs[i].prev_intra4x4_pred_mode_flag[j] = j & 1;
				slice->mbs[i].rem_intra4x4_pred_mode[j] = j >> 1;
			}
			for (j = 0; j < 4; j++) {
				slice->mbs[i].prev_intra8x8_pred_mode_flag[j] = j & 1;
				slice->mbs[i].rem_intra8x8_pred_mode[j] = j >> 1;
			}
		}
		if (slice->mbs[i].mb_type < H264_MB_TYPE_P_BASE) {
			slice->mbs[i].intra_chroma_pred_mode = i >> 2 & 3;
		}
		if (slice->mbs[i].mb_type == H264_MB_TYPE_P_SKIP || slice->mbs[i].mb_type == H264_MB_TYPE_B_SKIP) {
			slice->mbs[i].mb_field_decoding_flag = 0;
			slice->mbs[i].coded_block_pattern = 0;
			slice->mbs[i].transform_size_8x8_flag = 0;
			slice->mbs[i].mb_qp_delta = 0;
			slice->mbs[i].intra_chroma_pred_mode = 0;
		} else if (slice->mbs[i].mb_type == H264_MB_TYPE_I_PCM) {
			slice->mbs[i].coded_block_pattern = 0x2f;
			slice->mbs[i].transform_size_8x8_flag = 0;
			slice->mbs[i].mb_qp_delta = 0;
			slice->mbs[i].intra_chroma_pred_mode = 0;
			for (j = 0; j < 256; j++) {
				if (i & 1)
					slice->mbs[i].pcm_sample_chroma[j] = j;
				if (i & 2)
					slice->mbs[i].pcm_sample_luma[j] = j;
			}
		} else {
			if (h264_is_intra_16x16_mb_type(slice->mbs[i].mb_type)) {
				int mbt = slice->mbs[i].mb_type;
				int infer_cbp = (((mbt - H264_MB_TYPE_I_16X16_0_0_0) >> 2) % 3) << 4;
				if (mbt >= H264_MB_TYPE_I_16X16_0_0_1)
					infer_cbp |= 0xf;
				slice->mbs[i].coded_block_pattern = infer_cbp;
				slice->mbs[i].transform_size_8x8_flag = 0;
				for (j = 0; j < 16; j++) {
					slice->mbs[i].block_luma_dc[0][j] = 0x100 + j;
					if (slice->mbs[i].coded_block_pattern >> (j >> 2) & 1) {
						for (k = 0; k < 15; k++) {
							if (j) {
								slice->mbs[i].block_luma_ac[0][j][k] = j * 16 + k + 1;
							}
						}
					}
				}
			} else {
				if (!slice->mbs[i].coded_block_pattern)
					slice->mbs[i].mb_qp_delta = 0;
				for (j = 0; j < 16; j++) {
					if (slice->mbs[i].coded_block_pattern >> (j >> 2) & 1) {
						for (k = 0; k < 16; k++) {
							if (j) {
								slice->mbs[i].block_luma_4x4[0][j][k] = j * 16 + k;
								slice->mbs[i].block_luma_8x8[0][j>>2][(j&3)*16+k] = j*16 + k;
							}
						}
					}
				}
			}
			if (slice->mbs[i].coded_block_pattern & 0x30) {
				for (k = 0; k < 4; k++) {
					slice->mbs[i].block_chroma_dc[i&1][k] = -0x10 + k;
				}
			}
			if (slice->mbs[i].coded_block_pattern & 0x20) {
				for (j = 0; j < 4; j++) {
					for (k = 0; k < 15; k++) {
						if (j != 1)
							slice->mbs[i].block_chroma_ac[i>>1&1][j][k] = k - 0x1000 + j * 0x100;
					}
				}
			}
		}
		if (!slice->mbaff_frame_flag)
			slice->mbs[i].mb_field_decoding_flag = slice->field_pic_flag;
	}
	slice->last_mb_in_slice = i - 1;
	
	if (h264_slice_data(str, slice)) return 1;

	if (out)
		fwrite(str->bytes, str->bytesnum, 1, out);

	struct bitstream *nstr = vs_new_decode(VS_H264, str->bytes, str->bytesnum);
	if (vs_start(nstr, &val))
		return 1;
	if (val != 0xde) {
		fprintf (stderr, "Fail 1\n");
		return 1;
	}
	if (h264_slice_data(nstr, slice)) {
		h264_print_slice_data(slice);
		return 1;
	}
	h264_print_slice_data(slice);

	fprintf (stderr, "All ok!\n");

	return 0;
}